

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O2

void __thiscall
Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Node
          (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar1;
  
  pNVar1 = this->left;
  if (pNVar1 != (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x40);
    this->left = (pointer)0x0;
  }
  pNVar1 = this->right;
  if (pNVar1 != (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x40);
    this->right = (pointer)0x0;
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Node()
	{
		if(left)
		{
			delete left;
			left = nullptr;
		}

		if(right)
		{
			delete right;
			right = nullptr;
		}
	}